

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::erase(InnerMap *this,iterator it)

{
  void **ppvVar1;
  Node *item;
  bool bVar2;
  LogMessage *pLVar3;
  Node *pNVar4;
  size_type sVar5;
  size_type sVar6;
  LogFinisher local_69;
  iterator tree_it;
  LogMessage local_60;
  
  if (it.m_ != this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x248);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (it.m_) == (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&tree_it,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  tree_it._M_node = (_Base_ptr)0x0;
  bVar2 = iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
          ::revalidate_if_necessary(&it,&tree_it);
  sVar5 = it.bucket_index_;
  item = it.node_;
  ppvVar1 = this->table_;
  pNVar4 = (Node *)ppvVar1[it.bucket_index_];
  if (bVar2) {
    if ((pNVar4 == (Node *)0x0) || (pNVar4 == (Node *)ppvVar1[it.bucket_index_ ^ 1])) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x24e);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: TableEntryIsNonEmptyList(b): ");
      internal::LogFinisher::operator=(&local_69,pLVar3);
      internal::LogMessage::~LogMessage(&local_60);
      pNVar4 = (Node *)this->table_[sVar5];
    }
    pNVar4 = EraseFromLinkedList(this,item,pNVar4);
    sVar6 = sVar5;
  }
  else {
    if ((pNVar4 == (Node *)0x0) || (pNVar4 != (Node *)ppvVar1[it.bucket_index_ ^ 1])) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x253);
      pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: TableEntryIsTree(b): ");
      internal::LogFinisher::operator=(&local_69,pLVar3);
      internal::LogMessage::~LogMessage(&local_60);
      pNVar4 = (Node *)this->table_[sVar5];
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             *)pNVar4,(key_type *)(tree_it._M_node + 1));
    if (pNVar4[1].kv.k_._M_dataplus._M_p != (pointer)0x0) goto LAB_004e02ad;
    sVar6 = sVar5 & 0xfffffffffffffffe;
    DestroyTree(this,(Tree *)pNVar4);
    *(undefined8 *)((long)this->table_ + (sVar5 << 3 | 8)) = 0;
    pNVar4 = (Node *)0x0;
  }
  this->table_[sVar6] = pNVar4;
  sVar5 = sVar6;
LAB_004e02ad:
  DestroyNode(this,item);
  this->num_elements_ = this->num_elements_ - 1;
  if (sVar5 == this->index_of_first_non_null_) {
    while ((sVar5 < this->num_buckets_ && (this->table_[sVar5] == (void *)0x0))) {
      sVar5 = sVar5 + 1;
      this->index_of_first_non_null_ = sVar5;
    }
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(*tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = NULL;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (GOOGLE_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == NULL) {
          ++index_of_first_non_null_;
        }
      }
    }